

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# send_functions.hpp
# Opt level: O0

void so_5::impl::instantiator_and_sender_base<so_5::stats::messages::distribution_started,_false>::
     send<>(mbox_t *to)

{
  message_mutability_t mutability;
  abstract_message_box_t *this;
  unique_ptr<so_5::stats::messages::distribution_started,_std::default_delete<so_5::stats::messages::distribution_started>_>
  local_20;
  type_index local_18;
  mbox_t *local_10;
  mbox_t *to_local;
  
  local_10 = to;
  this = intrusive_ptr_t<so_5::abstract_message_box_t>::operator->(to);
  local_18 = message_payload_type_impl<so_5::stats::messages::distribution_started,_true>::
             subscription_type_index();
  details::make_message_instance<so_5::stats::messages::distribution_started>();
  mutability = message_payload_type_impl<so_5::stats::messages::distribution_started,_true>::
               mutability();
  abstract_message_box_t::deliver_message<so_5::stats::messages::distribution_started>
            (this,local_18,&local_20,mutability);
  std::
  unique_ptr<so_5::stats::messages::distribution_started,_std::default_delete<so_5::stats::messages::distribution_started>_>
  ::~unique_ptr(&local_20);
  return;
}

Assistant:

static void
			send(
				const so_5::mbox_t & to,
				ARGS &&... args )
				{
					to->deliver_message(
						message_payload_type< MESSAGE >::subscription_type_index(),
						so_5::details::make_message_instance< MESSAGE >(
								std::forward< ARGS >( args )...),
						message_payload_type< MESSAGE >::mutability() );
				}